

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
llb_buildsystem_command_interface_spawn::ForwardingProcessDelegate::processHadOutput(llbuild::basic
::ProcessContext*,llbuild::basic::ProcessHandle,llvm::StringRef_
          (void *this,ProcessContext *ctx,ProcessHandle handle,StringRef data)

{
  size_t local_50;
  llb_data_t message;
  ProcessContext *ctx_local;
  ForwardingProcessDelegate *this_local;
  StringRef data_local;
  ProcessHandle handle_local;
  
  local_50 = data.Length;
  message.length = (uint64_t)data.Data;
  if (*(long *)((long)this + 8) != 0) {
    message.data = (uint8_t *)ctx;
    (**(code **)(*(long *)((long)this + 8) + 0x18))(**(undefined8 **)((long)this + 8),&local_50);
  }
  return;
}

Assistant:

virtual void processHadOutput(ProcessContext* ctx, ProcessHandle handle,
                                  StringRef data) {
      if (delegate != NULL) {
        llb_data_t message{ data.size(), (const uint8_t*) data.data() };
        delegate->process_had_output(delegate->context, &message);
      }
    }